

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

Cardinality testing::Between(int min,int max)

{
  linked_ptr_internal extraout_RDX;
  Cardinality *in_RDI;
  Cardinality CVar1;
  int in_stack_00000238;
  int in_stack_0000023c;
  BetweenCardinalityImpl *in_stack_00000240;
  Cardinality *this;
  
  this = in_RDI;
  operator_new(0x10);
  anon_unknown_18::BetweenCardinalityImpl::BetweenCardinalityImpl
            (in_stack_00000240,in_stack_0000023c,in_stack_00000238);
  Cardinality::Cardinality(this,(CardinalityInterface *)in_RDI);
  CVar1.impl_.link_.next_ = extraout_RDX.next_;
  CVar1.impl_.value_ = (CardinalityInterface *)this;
  return (Cardinality)CVar1.impl_;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}